

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O1

upb_UnknownCompareResult
CompareUnknownWithMaxDepth(UnknownFields *uf1,UnknownFields *uf2,int max_depth)

{
  upb_UnknownCompareResult uVar1;
  upb_Arena *a;
  upb_Arena *a_00;
  upb_Message *msg;
  upb_Message *msg_00;
  string buf2;
  string buf1;
  string local_70;
  string local_50;
  
  a = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  a_00 = upb_Arena_Init((void *)0x0,0,&upb_alloc_global);
  msg = (upb_Message *)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)msg) < 0x3c8) {
    msg = (upb_Message *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x3c8);
  }
  else {
    if ((upb_Message *)((ulong)((long)&msg->field_0 + 7U) & 0xfffffffffffffff8) != msg)
    goto LAB_00186ac7;
    a->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg + 0x79);
  }
  if (msg == (upb_Message *)0x0) {
    msg = (upb_Message *)0x0;
  }
  else {
    memset(msg,0,0x3c8);
  }
  msg_00 = (upb_Message *)a_00->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a_00->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x3c8) {
    msg_00 = (upb_Message *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a_00,0x3c8);
  }
  else {
    if ((upb_Message *)((ulong)((long)&msg_00->field_0 + 7U) & 0xfffffffffffffff8) != msg_00) {
LAB_00186ac7:
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a_00->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00 + 0x79);
  }
  if (msg_00 == (upb_Message *)0x0) {
    msg_00 = (upb_Message *)0x0;
  }
  else {
    memset(msg_00,0,0x3c8);
  }
  ToBinaryPayload_abi_cxx11_(&local_50,uf1);
  ToBinaryPayload_abi_cxx11_(&local_70,uf2);
  if (((ulong)msg->field_0 & 1) == 0) {
    _upb_Message_AddUnknownSlowPath_dont_copy_me__upb_internal_use_only
              (msg,local_50._M_dataplus._M_p,local_50._M_string_length,a,false);
    if (((ulong)msg_00->field_0 & 1) == 0) {
      _upb_Message_AddUnknownSlowPath_dont_copy_me__upb_internal_use_only
                (msg_00,local_70._M_dataplus._M_p,local_70._M_string_length,a_00,false);
      uVar1 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only
                        (msg,msg_00,max_depth);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      upb_Arena_Free(a_00);
      upb_Arena_Free(a);
      return uVar1;
    }
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/message.h"
                ,0x9a,
                "bool _upb_Message_AddUnknown_dont_copy_me__upb_internal_use_only(struct upb_Message *, const char *, size_t, upb_Arena *, bool)"
               );
}

Assistant:

upb_UnknownCompareResult CompareUnknownWithMaxDepth(UnknownFields uf1,
                                                    UnknownFields uf2,
                                                    int max_depth) {
  upb::Arena arena1;
  upb::Arena arena2;
  protobuf_test_messages_proto2_TestAllTypesProto2* msg1 =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena1.ptr());
  protobuf_test_messages_proto2_TestAllTypesProto2* msg2 =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena2.ptr());
  // Add the unknown fields to the messages.
  std::string buf1 = ToBinaryPayload(uf1);
  std::string buf2 = ToBinaryPayload(uf2);
  UPB_PRIVATE(_upb_Message_AddUnknown)(UPB_UPCAST(msg1), buf1.data(),
                                       buf1.size(), arena1.ptr(), false);
  UPB_PRIVATE(_upb_Message_AddUnknown)(UPB_UPCAST(msg2), buf2.data(),
                                       buf2.size(), arena2.ptr(), false);
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(
      UPB_UPCAST(msg1), UPB_UPCAST(msg2), max_depth);
}